

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

int __thiscall QThreadPool::activeThreadCount(QThreadPool *this)

{
  qsizetype *this_00;
  qsizetype *pqVar1;
  long lVar2;
  void *copy;
  int iVar3;
  QObjectData *pQVar4;
  QBindingStatus *pQVar5;
  QObject *pQVar6;
  int iVar7;
  
  pQVar4 = (this->super_QObject).d_ptr.d;
  this_00 = &pQVar4[1].children.d.size;
  if (pQVar4[1].children.d.size == 0) {
    LOCK();
    lVar2 = *this_00;
    if (lVar2 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar2 == 0) goto LAB_003d470a;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_003d470a:
  if (*(long *)&pQVar4[1].field_0x30 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = (int)*(undefined8 *)(*(long *)&pQVar4[1].field_0x30 + 8);
  }
  pQVar5 = pQVar4[1].bindingStorage.bindingStatus;
  pQVar6 = pQVar4[2].parent;
  iVar3 = *(int *)&pQVar4[3].q_ptr;
  LOCK();
  pqVar1 = &pQVar4[1].children.d.size;
  copy = (void *)*pqVar1;
  *pqVar1 = 0;
  UNLOCK();
  if (copy != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  }
  return iVar3 + (iVar7 - ((int)pQVar6 + (int)pQVar5));
}

Assistant:

T *get() const noexcept
    {
        return d;
    }